

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O0

Aig_Obj_t ** Ssw_ClassesReadClass(Ssw_Cla_t *p,Aig_Obj_t *pRepr,int *pnSize)

{
  int *pnSize_local;
  Aig_Obj_t *pRepr_local;
  Ssw_Cla_t *p_local;
  
  if (p->pId2Class[pRepr->Id] == (Aig_Obj_t **)0x0) {
    p_local = (Ssw_Cla_t *)0x0;
  }
  else {
    if (p->pId2Class[pRepr->Id] == (Aig_Obj_t **)0x0) {
      __assert_fail("p->pId2Class[pRepr->Id] != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                    ,0x137,"Aig_Obj_t **Ssw_ClassesReadClass(Ssw_Cla_t *, Aig_Obj_t *, int *)");
    }
    if (p->pClassSizes[pRepr->Id] < 2) {
      __assert_fail("p->pClassSizes[pRepr->Id] > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                    ,0x138,"Aig_Obj_t **Ssw_ClassesReadClass(Ssw_Cla_t *, Aig_Obj_t *, int *)");
    }
    *pnSize = p->pClassSizes[pRepr->Id];
    p_local = (Ssw_Cla_t *)p->pId2Class[pRepr->Id];
  }
  return (Aig_Obj_t **)p_local;
}

Assistant:

Aig_Obj_t ** Ssw_ClassesReadClass( Ssw_Cla_t * p, Aig_Obj_t * pRepr, int * pnSize )
{
    if ( p->pId2Class[pRepr->Id] == NULL )
        return NULL;
    assert( p->pId2Class[pRepr->Id] != NULL );
    assert( p->pClassSizes[pRepr->Id] > 1 );
    *pnSize = p->pClassSizes[pRepr->Id];
    return p->pId2Class[pRepr->Id];
}